

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

RepeatedField<float> * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::RepeatedField<float>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  FieldDescriptor *message_00;
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  string *value;
  RepeatedField<float> *pRVar3;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  local_59 = 0;
  if ((bVar1) && (bVar1 = HasOneofField(this,(Message *)field_local,local_20), !bVar1)) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5c5);
    local_59 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: !schema_.InRealOneof(field) || HasOneofField(message, field): "
                       );
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"Field = ");
    value = FieldDescriptor::full_name_abi_cxx11_(local_20);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(local_6d,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  message_00 = field_local;
  offset = internal::ReflectionSchema::GetFieldOffset(&this->schema_,local_20);
  pRVar3 = internal::GetConstRefAtOffset<google::protobuf::RepeatedField<float>>
                     ((Message *)message_00,offset);
  return pRVar3;
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();
  return internal::GetConstRefAtOffset<Type>(message,
                                             schema_.GetFieldOffset(field));
}